

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O0

void __thiscall psy::C::TypeCheckerTester::case0530(TypeCheckerTester *this)

{
  Expectation *pEVar1;
  string local_1e0;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCheckerTester *this_local;
  
  local_18 = "\nvoid _ ()\n{\n    double x ;\n    ~ x ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nvoid _ ()\n{\n    double x ;\n    ~ x ;\n}\n",&local_39);
  Expectation::Expectation(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_1e0,
             (string *)
             &TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfIntegerType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1c0,Error,&local_1e0);
  Expectation::Expectation(&local_108,pEVar1);
  checkTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_1e0);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCheckerTester::case0530()
{
    auto s = R"(
void _ ()
{
    double x ;
    ~ x ;
}
)";

    checkTypes(s,
               Expectation()
                   .diagnostic(Expectation::ErrorOrWarn::Error,
                               TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfIntegerType));
}